

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O1

void __thiscall pg::FPISolver::run_par(FPISolver *this,WorkerP *__lace_worker,Task *__lace_dq_head)

{
  uint uVar1;
  Game *pGVar2;
  int *piVar3;
  uint64_t *puVar4;
  ostream *poVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint64_t uVar14;
  int iVar15;
  long lVar16;
  
  pGVar2 = (this->super_Solver).game;
  uVar1 = *(uint *)((long)pGVar2->_priority + ((pGVar2->n_vertices << 0x20) + -0x100000000 >> 0x1e))
  ;
  lVar16 = (long)(int)uVar1;
  uVar8 = 0xffffffffffffffff;
  if (-2 < lVar16) {
    uVar8 = lVar16 * 4 + 4;
  }
  pvVar6 = operator_new__(uVar8);
  pvVar7 = operator_new__(uVar8);
  if (-1 < lVar16) {
    piVar3 = pGVar2->_priority;
    uVar8 = 0;
    iVar15 = 0;
    do {
      uVar10 = (ulong)iVar15;
      if (uVar8 == (uint)piVar3[uVar10]) {
        *(int *)((long)pvVar6 + uVar8 * 4) = iVar15;
        iVar11 = iVar15;
        if ((long)uVar10 < pGVar2->n_vertices) {
          puVar4 = (this->parity)._bits;
          do {
            if (uVar8 != (uint)piVar3[uVar10]) break;
            uVar12 = uVar10 >> 6;
            uVar13 = 1L << (uVar10 & 0x3f);
            if ((uVar8 & 1) == 0) {
              uVar14 = ~uVar13 & puVar4[uVar12];
            }
            else {
              uVar14 = uVar13 | puVar4[uVar12];
            }
            puVar4[uVar12] = uVar14;
            uVar10 = uVar10 + 1;
          } while ((long)uVar10 < pGVar2->n_vertices);
          iVar11 = (int)uVar10;
        }
        iVar9 = iVar11 - iVar15;
        iVar15 = iVar11;
      }
      else {
        *(undefined4 *)((long)pvVar6 + uVar8 * 4) = 0xffffffff;
        iVar9 = 0;
      }
      *(int *)((long)pvVar7 + uVar8 * 4) = iVar9;
      uVar8 = uVar8 + 1;
    } while (uVar8 != (ulong)uVar1 + 1);
  }
  this->iterations = 1;
  if (-1 < (int)uVar1) {
    iVar15 = 0;
    do {
      lVar16 = (long)iVar15;
      iVar9 = *(int *)((long)pvVar7 + lVar16 * 4);
      if (iVar9 == 0) {
LAB_00159fde:
        iVar15 = iVar15 + 1;
      }
      else {
        iVar9 = update_block_rec(this,__lace_worker,__lace_dq_head,
                                 *(int *)((long)pvVar6 + lVar16 * 4),iVar9);
        if (iVar9 == 0) goto LAB_00159fde;
        if (iVar15 != 0) {
          freeze_thaw_reset_rec_CALL
                    (__lace_worker,__lace_dq_head,this,0,*(int *)((long)pvVar6 + lVar16 * 4),iVar15)
          ;
        }
        this->iterations = this->iterations + 1;
        iVar15 = 0;
        if (1 < (this->super_Solver).trace) {
          poVar5 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"restarting after finding distractions",0x25);
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
        }
      }
    } while (iVar15 <= (int)uVar1);
  }
  operator_delete__(pvVar6);
  operator_delete__(pvVar7);
  return;
}

Assistant:

void
FPISolver::run_par(WorkerP* __lace_worker, Task* __lace_dq_head)
{
    int d = this->priority(this->nodecount()-1);
    int *p_start = new int[d+1];
    int *p_len = new int[d+1];

    // initialize p_start, p_len, parity
    {
        int v=0;
        for (int p=0; p<=d; p++) {
            if (this->priority(v) == p) {
                p_start[p] = v;
                while (v < this->nodecount() and this->priority(v) == p) {
                    this->parity[v] = p&1;
                    v++;
                }
                p_len[p] = v - p_start[p];
            } else {
                p_start[p] = -1;
                p_len[p] = 0;
            }
        }
    }

    this->iterations = 1;
    int p = 0;
    while (p <= d) {
        if (p_len[p] == 0) {
            p++;
        } else if (CALL(update_block_rec, this, p_start[p], p_len[p])) {
            // something changed, freeze and reset
            if (p != 0) {
                CALL(freeze_thaw_reset_rec, this, 0, p_start[p], p);
                p = 0;
            }
            this->iterations++;
#ifndef NDEBUG
            if (this->trace >= 2) this->logger << "restarting after finding distractions" << std::endl;
#endif
        } else {
            // nothing changed
            p++;
        }
    }

    delete[] p_start;
    delete[] p_len;
}